

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorLuminancePicker::setVal(QColorLuminancePicker *this,int v)

{
  int iVar1;
  int iVar2;
  
  if (this->val == v) {
    return;
  }
  iVar1 = 0xff;
  if (v < 0xff) {
    iVar1 = v;
  }
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  this->val = iVar2;
  if (this->pix != (QPixmap *)0x0) {
    (**(code **)(*(long *)this->pix + 8))();
  }
  this->pix = (QPixmap *)0x0;
  QWidget::repaint(&this->super_QWidget);
  newHsv(this,this->hue,this->sat,this->val);
  return;
}

Assistant:

void QColorLuminancePicker::setVal(int v)
{
    if (val == v)
        return;
    val = qMax(0, qMin(v,255));
    delete pix; pix=nullptr;
    repaint();
    emit newHsv(hue, sat, val);
}